

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_class.h
# Opt level: O2

kNode * new_MethodNode(KonohaContext *kctx,kNameSpace *ns,KClass *reqc,kMethod *mtd,int n,...)

{
  _func_void_kObjectVar_ptr_kObjectVar_ptr_kObjectVar_ptr *p_Var1;
  kObjectVar *pkVar2;
  char in_AL;
  kNodeVar *self;
  kObject_conflict *pkVar3;
  kNode *pkVar4;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_108;
  undefined1 local_e8 [40];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_c0 = in_R9;
  self = (kNodeVar *)
         (*kctx->klib->new_kObject)
                   (kctx,kctx->stack->gcStack,(KClass *)(*kctx->runtimeModels)[1].freeModel,
                    (uintptr_t)ns);
  p_Var1 = (kctx->platApi->GCModule).UpdateObjectField;
  pkVar2 = (kObjectVar *)(self->field_5).NodeList;
  pkVar3 = (*kctx->klib->new_kObject)
                     (kctx,(kArray *)0x0,
                      *(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x30),0);
  (*p_Var1)((kObjectVar *)self,pkVar2,pkVar3);
  pkVar3 = (*kctx->klib->new_kObject)
                     (kctx,(kArray *)0x0,
                      *(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x30),0);
  (self->field_5).NodeList = (kArray *)pkVar3;
  (*kctx->klib->kArray_Add)(kctx,(kArray *)pkVar3,mtd);
  local_108.reg_save_area = local_e8;
  local_108.overflow_arg_area = &stack0x00000008;
  local_108.gp_offset = 0x28;
  local_108.fp_offset = 0x30;
  pkVar4 = kNode_AddSeveral(kctx,self,n,&local_108);
  pkVar4->nodeType = 9;
  pkVar4 = TypeCheckMethodParam(kctx,mtd,pkVar4,ns,reqc);
  return pkVar4;
}

Assistant:

static kNode *new_MethodNode(KonohaContext *kctx, kNameSpace *ns, KClass *reqc, kMethod *mtd, int n, ...)
{
	kNode *expr = new_(Node, ns, OnGcStack);
	KFieldSet(expr, expr->NodeList, new_(Array, 0, OnField));
	KLIB kArray_Add(kctx, expr->NodeList, mtd);
	va_list ap;
	va_start(ap, n);
	expr = kNode_AddSeveral(kctx, expr, n, ap);
	va_end(ap);
	kNode_setnode(expr, KNode_MethodCall);
	return TypeCheckMethodParam(kctx, mtd, expr, ns, reqc);
}